

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _PDCLIB_mktime_tzname.c
# Opt level: O3

time_t time1(tm *tmp,_func_tm_ptr_state_ptr_time_t_ptr_int_fast32_t_tm_ptr *funcp,state *sp,
            int_fast32_t offset)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  time_t tVar4;
  int *piVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  bool bVar10;
  _Bool okay;
  uchar types [256];
  char seen [256];
  _Bool local_255;
  int_fast32_t local_254;
  ulong local_250;
  _func_tm_ptr_state_ptr_time_t_ptr_int_fast32_t_tm_ptr *local_248;
  state *local_240;
  byte abStack_238 [256];
  char local_138 [264];
  
  if (tmp == (tm *)0x0) {
    piVar5 = _PDCLIB_errno_func();
    *piVar5 = 0x16;
  }
  else {
    if (1 < tmp->tm_isdst) {
      tmp->tm_isdst = 1;
    }
    tVar4 = time2(tmp,funcp,sp,offset,&local_255);
    if (local_255 != false) {
      return tVar4;
    }
    uVar9 = tmp->tm_isdst;
    if ((int)uVar9 < 0) {
      return tVar4;
    }
    if (sp == (state *)0x0) {
      return -1;
    }
    if (0 < (long)sp->typecnt) {
      memset(local_138,0,(long)sp->typecnt);
    }
    if ((long)sp->timecnt < 1) {
      return -1;
    }
    uVar3 = 0;
    lVar6 = (long)sp->timecnt + 0x3e97;
    do {
      bVar1 = *(byte *)((long)sp->ats + lVar6 + -0x18);
      if (local_138[bVar1] == '\0') {
        local_138[bVar1] = '\x01';
        lVar8 = (long)(int)uVar3;
        uVar3 = uVar3 + 1;
        abStack_238[lVar8] = bVar1;
      }
      uVar7 = lVar6 - 0x3e97;
      lVar6 = lVar6 + -1;
    } while (1 < uVar7);
    if ((int)uVar3 < 1) {
      return -1;
    }
    local_250 = 0;
    local_254 = offset;
    local_248 = funcp;
    local_240 = sp;
    do {
      bVar1 = abStack_238[local_250];
      if (uVar9 == sp->ttis[bVar1].isdst) {
        uVar7 = 0;
        do {
          bVar2 = abStack_238[uVar7];
          if (uVar9 != sp->ttis[bVar2].isdst) {
            tmp->tm_sec = tmp->tm_sec + (sp->ttis[bVar2].utoff - sp->ttis[bVar1].utoff);
            tmp->tm_isdst = (uint)(uVar9 == 0);
            tVar4 = time2(tmp,local_248,local_240,local_254,&local_255);
            if (local_255 != false) {
              return tVar4;
            }
            tmp->tm_sec = tmp->tm_sec + (sp->ttis[bVar1].utoff - sp->ttis[bVar2].utoff);
            bVar10 = tmp->tm_isdst == 0;
            uVar9 = (uint)bVar10;
            tmp->tm_isdst = (uint)bVar10;
          }
          uVar7 = uVar7 + 1;
        } while (uVar3 != uVar7);
      }
      local_250 = local_250 + 1;
    } while (local_250 != uVar3);
  }
  return -1;
}

Assistant:

static time_t time1( struct tm * tmp, struct tm *(*funcp)( struct state const *, time_t const *, int_fast32_t, struct tm * ), struct state const * sp, const int_fast32_t offset )
{
    time_t        t;
    int           samei, otheri;
    int           sameind, otherind;
    int           i;
    int           nseen;
    char          seen[TZ_MAX_TYPES];
    unsigned char types[TZ_MAX_TYPES];
    bool          okay;

    if ( tmp == NULL )
    {
        *_PDCLIB_errno_func() = _PDCLIB_EINVAL;
        return WRONG;
    }

    if ( tmp->tm_isdst > 1 )
    {
        tmp->tm_isdst = 1;
    }

    t = time2( tmp, funcp, sp, offset, &okay );

    if ( okay )
    {
        return t;
    }

    if ( tmp->tm_isdst < 0 )
    {
#ifdef PCTS
        /* POSIX Conformance Test Suite code courtesy Grant Sullivan. */
        tmp->tm_isdst = 0;  /* reset to std and try again */
#else
        return t;
#endif
    }

    /* We're supposed to assume that somebody took a time of one type
       and did some math on it that yielded a "struct tm" that's bad.
       We try to divine the type they started from and adjust to the
       type they need.
    */
    if ( sp == NULL )
    {
        return WRONG;
    }

    for ( i = 0; i < sp->typecnt; ++i )
    {
        seen[ i ] = false;
    }

    nseen = 0;

    for ( i = sp->timecnt - 1; i >= 0; --i )
    {
        if ( ! seen[ sp->types[ i ] ] )
        {
            seen[ sp->types[ i ] ] = true;
            types[ nseen++ ] = sp->types[ i ];
        }
    }

    for ( sameind = 0; sameind < nseen; ++sameind )
    {
        samei = types[ sameind ];

        if ( sp->ttis[ samei ].isdst != tmp->tm_isdst )
        {
            continue;
        }

        for ( otherind = 0; otherind < nseen; ++otherind )
        {
            otheri = types[ otherind ];

            if ( sp->ttis[ otheri ].isdst == tmp->tm_isdst )
            {
                continue;
            }

            tmp->tm_sec += ( sp->ttis[ otheri ].utoff - sp->ttis[ samei ].utoff );
            tmp->tm_isdst = ! tmp->tm_isdst;
            t = time2( tmp, funcp, sp, offset, &okay );

            if ( okay )
            {
                return t;
            }

            tmp->tm_sec -= ( sp->ttis[ otheri ].utoff - sp->ttis[ samei ].utoff );
            tmp->tm_isdst = ! tmp->tm_isdst;
        }
    }

    return WRONG;
}